

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O3

void __thiscall iDynTree::RevoluteJoint::RevoluteJoint(RevoluteJoint *this)

{
  LinkIndex LVar1;
  Position local_40 [24];
  Direction local_28;
  
  (this->super_MovableJointImpl1).super_IJoint._vptr_IJoint =
       (_func_int **)&PTR__RevoluteJoint_00185330;
  LVar1 = LINK_INVALID_INDEX;
  this->link1 = LINK_INVALID_INDEX;
  this->link2 = LVar1;
  iDynTree::Transform::Identity();
  iDynTree::Direction::Direction(&local_28,1.0,0.0,0.0);
  iDynTree::Position::Zero();
  iDynTree::Axis::Axis(&this->rotation_axis_wrt_link1,&local_28,local_40);
  iDynTree::Transform::Transform(&this->link1_X_link2);
  iDynTree::Transform::Transform(&this->link2_X_link1);
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[1] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[2] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[2] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[0] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[0] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[1] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[1] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[2] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[2] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[0] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[0] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[1] = 0.0;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x15])(this,0);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x17])(this,0);
  resetAxisBuffers(this);
  resetBuffers(this,0.0);
  this->m_hasPosLimits = false;
  this->m_minPos = -1.79769313486232e+308;
  this->m_maxPos = 1.79769313486232e+308;
  this->m_joint_dynamics_type = NoJointDynamics;
  this->m_damping = 0.0;
  this->m_static_friction = 0.0;
  return;
}

Assistant:

RevoluteJoint::RevoluteJoint():
        link1(LINK_INVALID_INDEX), link2(LINK_INVALID_INDEX), link1_X_link2_at_rest(Transform::Identity()),
        rotation_axis_wrt_link1(Axis(Direction(1.0, 0.0, 0.0), Position::Zero()))
{
    this->setPosCoordsOffset(0);
    this->setDOFsOffset(0);

    this->resetAxisBuffers();
    this->resetBuffers(0);
    this->disablePosLimits();
    this->resetJointDynamics();
}